

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O0

void __thiscall xmrig::OclConfig::OclConfig(OclConfig *this)

{
  String *in_RDI;
  String *this_00;
  
  *(undefined1 *)&in_RDI->m_data = 1;
  *(undefined1 *)((long)&in_RDI->m_data + 1) = 0;
  *(undefined1 *)((long)&in_RDI->m_data + 2) = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x20ed7c);
  this_00 = in_RDI + 2;
  String::String(this_00);
  String::String(in_RDI,(char *)this_00);
  Threads<xmrig::OclThreads>::Threads((Threads<xmrig::OclThreads> *)0x20edb4);
  *(undefined4 *)&in_RDI[7].m_data = 0;
  return;
}

Assistant:

xmrig::OclConfig::OclConfig() :
    m_platformVendor(kAMD)
{
}